

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::ListSortFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  initializer_list<duckdb::LogicalType> iVar3;
  ScalarFunctionSet *in_RDI;
  ScalarFunction sort_orders;
  ScalarFunction sort_order;
  ScalarFunction sort;
  ScalarFunctionSet *list_sort;
  allocator_type *in_stack_fffffffffffff528;
  allocator_type *paVar4;
  ScalarFunction *function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff530;
  vector<duckdb::LogicalType,_true> *pvVar5;
  ScalarFunction *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffff538;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *p_Var6;
  undefined4 in_stack_fffffffffffff540;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff544;
  undefined4 in_stack_fffffffffffff54c;
  LogicalType *in_stack_fffffffffffff550;
  LogicalType *pLVar8;
  ScalarFunction *this_00;
  ScalarFunctionSet *in_stack_fffffffffffff570;
  LogicalType *in_stack_fffffffffffff578;
  undefined1 **local_a20;
  undefined1 **local_a00;
  undefined1 **local_9e0;
  bind_scalar_function_extended_t in_stack_fffffffffffff650;
  bind_scalar_function_t in_stack_fffffffffffff658;
  scalar_function_t *in_stack_fffffffffffff660;
  LogicalType *in_stack_fffffffffffff668;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff670;
  ScalarFunction *in_stack_fffffffffffff678;
  function_statistics_t in_stack_fffffffffffff6b0;
  init_local_state_t in_stack_fffffffffffff6b8;
  LogicalType *in_stack_fffffffffffff6c0;
  FunctionStability in_stack_fffffffffffff6c8;
  FunctionNullHandling in_stack_fffffffffffff6d0;
  bind_lambda_function_t in_stack_fffffffffffff6d8;
  undefined1 *local_5b0 [9];
  undefined8 *local_568;
  undefined8 local_560;
  undefined1 local_418 [111];
  undefined1 local_3a9;
  undefined8 *local_390;
  undefined1 *local_388 [3];
  undefined1 local_370 [24];
  undefined8 *local_358;
  undefined8 local_350;
  undefined1 local_208 [107];
  undefined1 local_19d;
  undefined8 *local_178;
  undefined1 *local_170 [3];
  undefined8 *local_158;
  undefined8 local_150;
  
  local_19d = 1;
  local_178 = local_170;
  LogicalType::LogicalType
            (in_stack_fffffffffffff550,(LogicalTypeId)((uint)in_stack_fffffffffffff54c >> 0x18));
  LogicalType::LIST(in_stack_fffffffffffff578);
  local_19d = 0;
  local_158 = local_170;
  local_150 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x2028e8e);
  iVar1._M_len._0_4_ = in_stack_fffffffffffff540;
  iVar1._M_array = (iterator)in_stack_fffffffffffff538;
  iVar1._M_len._4_4_ = in_stack_fffffffffffff544;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffff530,iVar1,in_stack_fffffffffffff528);
  LogicalType::LogicalType
            (in_stack_fffffffffffff550,(LogicalTypeId)((uint)in_stack_fffffffffffff54c >> 0x18));
  LogicalType::LIST(in_stack_fffffffffffff578);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),in_stack_fffffffffffff538
            );
  LogicalType::LogicalType
            (in_stack_fffffffffffff550,(LogicalTypeId)((uint)in_stack_fffffffffffff54c >> 0x18));
  p_Var6 = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_208;
  pLVar8 = (LogicalType *)0x0;
  uVar7 = 0;
  pvVar5 = (vector<duckdb::LogicalType,_true> *)0x0;
  paVar4 = (allocator_type *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffff678,in_stack_fffffffffffff670,in_stack_fffffffffffff668,
             in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650,
             in_stack_fffffffffffff6b0,in_stack_fffffffffffff6b8,in_stack_fffffffffffff6c0,
             in_stack_fffffffffffff6c8,in_stack_fffffffffffff6d0,in_stack_fffffffffffff6d8);
  LogicalType::~LogicalType((LogicalType *)0x2028f79);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x2028f86);
  LogicalType::~LogicalType((LogicalType *)0x2028f93);
  LogicalType::~LogicalType((LogicalType *)0x2028fa0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2028fad);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x2028fba);
  local_9e0 = (undefined1 **)&local_158;
  do {
    local_9e0 = local_9e0 + -3;
    LogicalType::~LogicalType((LogicalType *)0x2028fef);
  } while (local_9e0 != local_170);
  LogicalType::~LogicalType((LogicalType *)0x2029019);
  local_3a9 = 1;
  local_390 = local_388;
  LogicalType::LogicalType(pLVar8,(LogicalTypeId)((uint)in_stack_fffffffffffff54c >> 0x18));
  LogicalType::LIST(in_stack_fffffffffffff578);
  local_390 = (undefined8 *)local_370;
  LogicalType::LogicalType(pLVar8,(LogicalTypeId)((uint)in_stack_fffffffffffff54c >> 0x18));
  local_3a9 = 0;
  local_358 = local_388;
  local_350 = 2;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x20290b1);
  iVar2._M_len._0_4_ = uVar7;
  iVar2._M_array = (iterator)p_Var6;
  iVar2._M_len._4_4_ = in_stack_fffffffffffff544;
  vector<duckdb::LogicalType,_true>::vector(pvVar5,iVar2,paVar4);
  LogicalType::LogicalType(pLVar8,(LogicalTypeId)((uint)in_stack_fffffffffffff54c >> 0x18));
  LogicalType::LIST(in_stack_fffffffffffff578);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff544,uVar7),p_Var6);
  LogicalType::LogicalType(pLVar8,(LogicalTypeId)((uint)in_stack_fffffffffffff54c >> 0x18));
  p_Var6 = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_418;
  pLVar8 = (LogicalType *)0x0;
  uVar7 = 0;
  pvVar5 = (vector<duckdb::LogicalType,_true> *)0x0;
  paVar4 = (allocator_type *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffff678,in_stack_fffffffffffff670,in_stack_fffffffffffff668,
             in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650,
             in_stack_fffffffffffff6b0,in_stack_fffffffffffff6b8,in_stack_fffffffffffff6c0,
             in_stack_fffffffffffff6c8,in_stack_fffffffffffff6d0,in_stack_fffffffffffff6d8);
  LogicalType::~LogicalType((LogicalType *)0x202919c);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x20291a9);
  LogicalType::~LogicalType((LogicalType *)0x20291b6);
  LogicalType::~LogicalType((LogicalType *)0x20291c3);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x20291d0);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x20291dd);
  local_a00 = (undefined1 **)&local_358;
  do {
    local_a00 = local_a00 + -3;
    LogicalType::~LogicalType((LogicalType *)0x2029212);
  } while (local_a00 != local_388);
  LogicalType::~LogicalType((LogicalType *)0x202923c);
  LogicalType::LogicalType(pLVar8,(LogicalTypeId)((uint)in_stack_fffffffffffff54c >> 0x18));
  LogicalType::LIST(in_stack_fffffffffffff578);
  LogicalType::LogicalType(pLVar8,(LogicalTypeId)((uint)in_stack_fffffffffffff54c >> 0x18));
  LogicalType::LogicalType(pLVar8,(LogicalTypeId)((uint)in_stack_fffffffffffff54c >> 0x18));
  local_568 = local_5b0;
  local_560 = 3;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x20292f0);
  iVar3._M_len._0_4_ = uVar7;
  iVar3._M_array = (iterator)p_Var6;
  iVar3._M_len._4_4_ = in_stack_fffffffffffff544;
  vector<duckdb::LogicalType,_true>::vector(pvVar5,iVar3,paVar4);
  LogicalType::LogicalType(pLVar8,(LogicalTypeId)((uint)in_stack_fffffffffffff54c >> 0x18));
  LogicalType::LIST(in_stack_fffffffffffff578);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff544,uVar7),p_Var6);
  LogicalType::LogicalType(pLVar8,(LogicalTypeId)((uint)in_stack_fffffffffffff54c >> 0x18));
  this_00 = (ScalarFunction *)0x0;
  uVar7 = 0;
  this = (ScalarFunction *)0x0;
  function = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffff678,in_stack_fffffffffffff670,in_stack_fffffffffffff668,
             in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650,
             in_stack_fffffffffffff6b0,in_stack_fffffffffffff6b8,in_stack_fffffffffffff6c0,
             in_stack_fffffffffffff6c8,in_stack_fffffffffffff6d0,in_stack_fffffffffffff6d8);
  LogicalType::~LogicalType((LogicalType *)0x20293db);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x20293e8);
  LogicalType::~LogicalType((LogicalType *)0x20293f5);
  LogicalType::~LogicalType((LogicalType *)0x2029402);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x202940f);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x202941c);
  local_a20 = (undefined1 **)&local_568;
  do {
    local_a20 = local_a20 + -3;
    LogicalType::~LogicalType((LogicalType *)0x2029451);
  } while (local_a20 != local_5b0);
  LogicalType::~LogicalType((LogicalType *)0x202947b);
  ScalarFunctionSet::ScalarFunctionSet(in_stack_fffffffffffff570);
  ScalarFunction::ScalarFunction
            (this_00,(ScalarFunction *)CONCAT44(in_stack_fffffffffffff54c,uVar7));
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,function);
  ScalarFunction::~ScalarFunction(this);
  ScalarFunction::ScalarFunction
            (this_00,(ScalarFunction *)CONCAT44(in_stack_fffffffffffff54c,uVar7));
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,function);
  ScalarFunction::~ScalarFunction(this);
  ScalarFunction::ScalarFunction
            (this_00,(ScalarFunction *)CONCAT44(in_stack_fffffffffffff54c,uVar7));
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,function);
  ScalarFunction::~ScalarFunction(this);
  ScalarFunction::~ScalarFunction(this);
  ScalarFunction::~ScalarFunction(this);
  ScalarFunction::~ScalarFunction(this);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ListSortFun::GetFunctions() {
	// one parameter: list
	ScalarFunction sort({LogicalType::LIST(LogicalType::ANY)}, LogicalType::LIST(LogicalType::ANY), ListSortFunction,
	                    ListNormalSortBind);

	// two parameters: list, order
	ScalarFunction sort_order({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR},
	                          LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListNormalSortBind);

	// three parameters: list, order, null order
	ScalarFunction sort_orders({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR, LogicalType::VARCHAR},
	                           LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListNormalSortBind);

	ScalarFunctionSet list_sort;
	list_sort.AddFunction(sort);
	list_sort.AddFunction(sort_order);
	list_sort.AddFunction(sort_orders);
	return list_sort;
}